

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O2

int __thiscall imrt::Station::get_nb_apertures(Station *this,string *strategy)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = std::operator==(strategy,"dao_ls");
  if (bVar1) {
    iVar2 = (int)((ulong)((long)(this->intensity).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->intensity).super__Vector_base<double,_std::allocator<double>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  else {
    bVar1 = std::operator==(strategy,"ibo_ls");
    if (bVar1) {
      iVar2 = (int)(this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    else {
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int get_nb_apertures(string strategy){
    if(strategy=="dao_ls")
       return (intensity.size());
    else if(strategy=="ibo_ls")
       return (int2nb.size());
    return(-1);
  }